

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_set_mfcfh(acmod_t *acmod,FILE *logfh)

{
  uint in_EAX;
  int rv;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if ((FILE *)acmod->mfcfh != (FILE *)0x0) {
    fclose((FILE *)acmod->mfcfh);
  }
  acmod->mfcfh = logfh;
  fwrite((void *)((long)&uStack_18 + 4),4,1,(FILE *)logfh);
  return uStack_18._4_4_;
}

Assistant:

int
acmod_set_mfcfh(acmod_t *acmod, FILE *logfh)
{
    int rv = 0;

    if (acmod->mfcfh)
        fclose(acmod->mfcfh);
    acmod->mfcfh = logfh;
    fwrite(&rv, 4, 1, acmod->mfcfh);
    return rv;
}